

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O0

int __thiscall
cppcms::applications_pool::mount
          (applications_pool *this,char *__special_file,char *__dir,char *__fstype,ulong __rwflag,
          void *__data)

{
  int extraout_EAX;
  _data *this_00;
  unique_lock<std::recursive_mutex> lock;
  shared_ptr<cppcms::application_specific_pool> p;
  legacy_async_pool *in_stack_ffffffffffffff18;
  application_specific_pool *in_stack_ffffffffffffff20;
  attachment *this_01;
  value_type *__x;
  intrusive_ptr<cppcms::application> *in_stack_ffffffffffffff38;
  legacy_async_pool *in_stack_ffffffffffffff40;
  value_type local_98;
  int in_stack_ffffffffffffffac;
  application_specific_pool *in_stack_ffffffffffffffb0;
  
  operator_new(0x28);
  booster::intrusive_ptr<cppcms::application>::intrusive_ptr
            ((intrusive_ptr<cppcms::application> *)in_stack_ffffffffffffff20,
             (intrusive_ptr<cppcms::application> *)in_stack_ffffffffffffff18);
  impl::legacy_async_pool::legacy_async_pool(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::shared_ptr<cppcms::application_specific_pool>::
  shared_ptr<cppcms::impl::legacy_async_pool,void>
            ((shared_ptr<cppcms::application_specific_pool> *)in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18);
  booster::intrusive_ptr<cppcms::application>::~intrusive_ptr
            ((intrusive_ptr<cppcms::application> *)in_stack_ffffffffffffff20);
  std::
  __shared_ptr_access<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x3aa5d6);
  booster::hold_ptr<cppcms::applications_pool::_data>::operator->(&this->d);
  application_specific_pool::size(in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18);
  std::
  __shared_ptr_access<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x3aa612);
  application_specific_pool::flags(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  booster::hold_ptr<cppcms::applications_pool::_data>::operator->(&this->d);
  std::unique_lock<std::recursive_mutex>::unique_lock
            ((unique_lock<std::recursive_mutex> *)in_stack_ffffffffffffff20,
             (mutex_type *)in_stack_ffffffffffffff18);
  this_00 = booster::hold_ptr<cppcms::applications_pool::_data>::operator->(&this->d);
  this_01 = (attachment *)&this_00->legacy_async_apps;
  __x = &local_98;
  std::shared_ptr<cppcms::application_specific_pool>::shared_ptr
            ((shared_ptr<cppcms::application_specific_pool> *)this_01,
             (shared_ptr<cppcms::application_specific_pool> *)in_stack_ffffffffffffff18);
  _data::attachment::attachment
            ((attachment *)this_00,(shared_ptr<cppcms::application_specific_pool> *)__x,&this_01->mp
            );
  std::__cxx11::
  list<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
  ::push_back(&this_00->apps,__x);
  _data::attachment::~attachment(this_01);
  std::shared_ptr<cppcms::application_specific_pool>::~shared_ptr
            ((shared_ptr<cppcms::application_specific_pool> *)0x3aa6c6);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)this_01)
  ;
  std::shared_ptr<cppcms::application_specific_pool>::~shared_ptr
            ((shared_ptr<cppcms::application_specific_pool> *)0x3aa6e0);
  return extraout_EAX;
}

Assistant:

void applications_pool::mount(booster::intrusive_ptr<application> app,mount_point const &mp)
{
	booster::shared_ptr<application_specific_pool> p(new impl::legacy_async_pool(app));
	p->size(d->thread_count);
	p->flags(app::legacy | app::asynchronous);

	booster::unique_lock<booster::recursive_mutex> lock(d->lock);
	d->legacy_async_apps.push_back(_data::attachment(p,mp));
}